

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O3

FunctionCodeGenJitTimeData * __thiscall
Js::FunctionCodeGenJitTimeData::AddLdFldInlinee
          (FunctionCodeGenJitTimeData *this,Recycler *recycler,InlineCacheIndex inlineCacheIndex,
          FunctionInfo *inlinee)

{
  Type *addr;
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  FunctionBody *pFVar7;
  Recycler *this_00;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *pWVar8;
  FunctionCodeGenJitTimeData *pFVar9;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  data._32_8_ = recycler;
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xa5,"(recycler)","recycler");
    if (!bVar3) goto LAB_00434468;
    *puVar6 = 0;
  }
  pFVar7 = GetFunctionBody(this);
  if (pFVar7 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xa7,"(functionBody)","functionBody");
    if (!bVar3) goto LAB_00434468;
    *puVar6 = 0;
  }
  pFVar7 = GetFunctionBody(this);
  uVar4 = FunctionBody::GetCountField(pFVar7,InlineCacheCount);
  if (uVar4 <= inlineCacheIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xa8,
                                "(inlineCacheIndex < GetFunctionBody()->GetInlineCacheCount())",
                                "inlineCacheIndex < GetFunctionBody()->GetInlineCacheCount()");
    if (!bVar3) goto LAB_00434468;
    *puVar6 = 0;
  }
  if (inlinee == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xa9,"(inlinee)","inlinee");
    if (!bVar3) goto LAB_00434468;
    *puVar6 = 0;
  }
  addr = &this->ldFldInlinees;
  if ((this->ldFldInlinees).ptr == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
    pFVar7 = GetFunctionBody(this);
    uVar4 = FunctionBody::GetCountField(pFVar7,InlineCacheCount);
    data.plusSize = (size_t)uVar4;
    local_70 = (undefined1  [8])&Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_d5b701;
    data.filename._0_4_ = 0xad;
    this_00 = Memory::Recycler::TrackAllocInfo((Recycler *)data._32_8_,(TrackAllocData *)local_70);
    pFVar7 = GetFunctionBody(this);
    uVar4 = FunctionBody::GetCountField(pFVar7,InlineCacheCount);
    if (uVar4 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      pWVar8 = (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)&DAT_00000008;
    }
    else {
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00434468;
        *puVar6 = 0;
      }
      pWVar8 = (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)
               Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                         (this_00,(ulong)uVar4 << 3);
      if (pWVar8 == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00434468;
        *puVar6 = 0;
      }
      memset(pWVar8,0,(ulong)uVar4 << 3);
    }
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pWVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  pFVar9 = New((Recycler *)data._32_8_,inlinee,(EntryPointInfo *)0x0,true);
  pWVar8 = addr->ptr;
  if (pWVar8[inlineCacheIndex].ptr != (FunctionCodeGenJitTimeData *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xb1,"(!ldFldInlinees[inlineCacheIndex])",
                                "!ldFldInlinees[inlineCacheIndex]");
    if (!bVar3) {
LAB_00434468:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    pWVar8 = addr->ptr;
  }
  pWVar8 = pWVar8 + inlineCacheIndex;
  Memory::Recycler::WBSetBit((char *)pWVar8);
  pWVar8->ptr = pFVar9;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar8);
  pTVar1 = &this->ldFldInlineeCount;
  *pTVar1 = *pTVar1 + 1;
  if (*pTVar1 != 0) {
    return pFVar9;
  }
  Throw::OutOfMemory();
}

Assistant:

FunctionCodeGenJitTimeData *FunctionCodeGenJitTimeData::AddLdFldInlinee(
        Recycler *const recycler,
        const InlineCacheIndex inlineCacheIndex,
        FunctionInfo *const inlinee)
    {
        Assert(recycler);
        const auto functionBody = GetFunctionBody();
        Assert(functionBody);
        Assert(inlineCacheIndex < GetFunctionBody()->GetInlineCacheCount());
        Assert(inlinee);

        if (!ldFldInlinees)
        {
            ldFldInlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenJitTimeData*), GetFunctionBody()->GetInlineCacheCount());
        }

        const auto inlineeData = FunctionCodeGenJitTimeData::New(recycler, inlinee, nullptr);
        Assert(!ldFldInlinees[inlineCacheIndex]);
        ldFldInlinees[inlineCacheIndex] = inlineeData;
        if (++ldFldInlineeCount == 0)
        {
            Js::Throw::OutOfMemory();
        }
        return inlineeData;
    }